

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::Postprocess_BuildMeshSet
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray,CAMFImporter_NodeElement_Color *pObjectColor,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode *pSceneNode)

{
  aiVector3D *paVar1;
  CAMFImporter_NodeElement_Color *pCVar2;
  CAMFImporter_NodeElement_TexMap *pCVar3;
  CAMFImporter_NodeElement_TexMap *pCVar4;
  CAMFImporter_NodeElement_TexMap *pCVar5;
  float fVar6;
  CAMFImporter_NodeElement_Color *pCVar7;
  bool bVar8;
  pointer *ppaVar9;
  reference ppCVar10;
  ulong uVar11;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar12;
  reference this_00;
  aiMesh *this_01;
  ulong *puVar13;
  const_reference pvVar14;
  DeadlyImportError *this_02;
  reference pvVar15;
  void *pvVar16;
  size_t sVar17;
  reference pvVar18;
  reference __x;
  aiVector3t<float> *paVar19;
  aiColor4t<float> *paVar20;
  reference pSVar21;
  size_type sVar22;
  uint *puVar23;
  reference puVar24;
  aiFace *paVar25;
  aiColor4D aVar26;
  aiVector3t<float> *local_4c8;
  aiColor4t<float> *local_490;
  aiVector3t<float> *local_468;
  float local_3b8;
  float fStack_3b4;
  float local_388;
  float fStack_384;
  aiFace *local_350;
  _List_const_iterator<unsigned_int> local_310;
  ulong local_308;
  size_t i_1;
  _List_const_iterator<unsigned_int> local_2f8;
  const_iterator mit;
  SComplexFace *face_cur_2;
  iterator __end4_1;
  iterator __begin4_1;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  *__range4_1;
  size_t idx_face;
  size_t idx_vert;
  size_t idx_ind_1;
  SComplexFace *face_cur_1;
  iterator __end5;
  iterator __begin5;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  *__range5;
  size_t i_e;
  size_t i;
  bool *idx_vert_used;
  size_t idx_vert_new;
  size_t idx_ind;
  string local_260;
  size_type local_240;
  size_t vert_idx_new;
  aiColor4D face_color;
  SComplexFace *face_cur;
  iterator __end4;
  iterator __begin4;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  *__range4;
  undefined8 local_200;
  value_type local_1f8;
  size_t local_1e8;
  size_t vert_idx_to;
  size_t vert_idx_from;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vert_arr;
  size_t VertexCount_Max;
  aiMesh *tmesh;
  anon_class_40_5_b0e7ad54 Vertex_CalculateColor;
  anon_class_1_0_00000001 VertexIndex_Replace;
  anon_class_1_0_00000001 VertexIndex_GetMinimal;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  *face_list_cur;
  iterator __end3_1;
  iterator __begin3_1;
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  *__range3_1;
  CAMFImporter_NodeElement *ne_triangle_child;
  const_iterator __end7;
  const_iterator __begin7;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range7;
  SComplexFace complex_face;
  CAMFImporter_NodeElement_Triangle *tri_al;
  CAMFImporter_NodeElement *ne_volume_child;
  const_iterator __end3;
  const_iterator __begin3;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range3;
  undefined1 local_b8 [8];
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  complex_faces_toplist;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  complex_faces_list;
  CAMFImporter_NodeElement_Volume *ne_volume;
  SPP_Material *cur_mat;
  CAMFImporter_NodeElement_Color *ne_volume_color;
  CAMFImporter_NodeElement *ne_child;
  const_iterator __end1;
  const_iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  list<unsigned_int,_std::allocator<unsigned_int>_> mesh_idx;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList_local;
  CAMFImporter_NodeElement_Color *pObjectColor_local;
  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  *pVertexColorArray_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray_local;
  CAMFImporter_NodeElement_Mesh *pNodeElement_local;
  AMFImporter *this_local;
  
  mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size =
       (size_t)pMeshList;
  pMeshList_local = (list<aiMesh_*,_std::allocator<aiMesh_*>_> *)pObjectColor;
  pObjectColor_local = (CAMFImporter_NodeElement_Color *)pVertexColorArray;
  pVertexColorArray_local =
       (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
        *)pVertexCoordinateArray;
  pVertexCoordinateArray_local =
       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pNodeElement;
  pNodeElement_local = (CAMFImporter_NodeElement_Mesh *)this;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  ppaVar9 = &pVertexCoordinateArray_local[2].
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                       *)ppaVar9);
  ne_child = (CAMFImporter_NodeElement *)
             std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                       ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                         *)ppaVar9);
  do {
    bVar8 = std::operator!=(&__end1,(_Self *)&ne_child);
    if (!bVar8) {
      bVar8 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      if (!bVar8) {
        i_1 = (size_t)std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_2f8,(iterator *)&i_1);
        sVar22 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        pSceneNode->mNumMeshes = (uint)sVar22;
        puVar23 = (uint *)operator_new__((ulong)pSceneNode->mNumMeshes << 2);
        pSceneNode->mMeshes = puVar23;
        for (local_308 = 0; local_308 < pSceneNode->mNumMeshes; local_308 = local_308 + 1) {
          local_310._M_node =
               (_List_node_base *)std::_List_const_iterator<unsigned_int>::operator++(&local_2f8,0);
          puVar24 = std::_List_const_iterator<unsigned_int>::operator*(&local_310);
          pSceneNode->mMeshes[local_308] = *puVar24;
        }
      }
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      return;
    }
    ppCVar10 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    pCVar2 = (CAMFImporter_NodeElement_Color *)*ppCVar10;
    cur_mat = (SPP_Material *)0x0;
    ne_volume = (CAMFImporter_NodeElement_Volume *)0x0;
    ne_volume_color = pCVar2;
    if ((pCVar2->super_CAMFImporter_NodeElement).Type == ENET_Volume) {
      std::__cxx11::
      list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>::
      list((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
            *)&complex_faces_toplist.
               super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
               ._M_impl._M_node._M_size);
      std::__cxx11::
      list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
      ::list((list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
              *)local_b8);
      uVar11 = std::__cxx11::string::empty();
      if (((uVar11 & 1) == 0) &&
         (bVar8 = Find_ConvertedMaterial
                            (this,(string *)&pCVar2->Composed,(SPP_Material **)&ne_volume), !bVar8))
      {
        Throw_ID_NotFound(this,(string *)&pCVar2->Composed);
      }
      plVar12 = &(pCVar2->super_CAMFImporter_NodeElement).Child;
      __end3 = std::__cxx11::
               list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                         (plVar12);
      ne_volume_child =
           (CAMFImporter_NodeElement *)
           std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                     (plVar12);
      while (bVar8 = std::operator!=(&__end3,(_Self *)&ne_volume_child), bVar8) {
        ppCVar10 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end3);
        pCVar3 = (CAMFImporter_NodeElement_TexMap *)*ppCVar10;
        pCVar4 = pCVar3;
        if (((pCVar3->super_CAMFImporter_NodeElement).Type != ENET_Color) &&
           (pCVar4 = (CAMFImporter_NodeElement_TexMap *)cur_mat,
           (pCVar3->super_CAMFImporter_NodeElement).Type == ENET_Triangle)) {
          complex_face.TexMap = pCVar3;
          SComplexFace::SComplexFace((SComplexFace *)&__range7);
          complex_face.Face.mIndices = (uint *)0x0;
          complex_face.Color = (CAMFImporter_NodeElement_Color *)0x0;
          sVar22 = std::__cxx11::
                   list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
                   size(&((complex_face.TexMap)->super_CAMFImporter_NodeElement).Child);
          if (sVar22 != 0) {
            plVar12 = &((complex_face.TexMap)->super_CAMFImporter_NodeElement).Child;
            __end7 = std::__cxx11::
                     list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
                     begin(plVar12);
            ne_triangle_child =
                 (CAMFImporter_NodeElement *)
                 std::__cxx11::
                 list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                           (plVar12);
            while (bVar8 = std::operator!=(&__end7,(_Self *)&ne_triangle_child), bVar8) {
              ppCVar10 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end7);
              pCVar2 = (CAMFImporter_NodeElement_Color *)*ppCVar10;
              pCVar7 = pCVar2;
              if (((pCVar2->super_CAMFImporter_NodeElement).Type != ENET_Color) &&
                 (pCVar7 = (CAMFImporter_NodeElement_Color *)complex_face.Face.mIndices,
                 (pCVar2->super_CAMFImporter_NodeElement).Type == ENET_TexMap)) {
                complex_face.Color = pCVar2;
              }
              complex_face.Face.mIndices = (uint *)pCVar7;
              std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end7);
            }
          }
          __range7._0_4_ = 3;
          complex_face.Face._0_8_ = operator_new__(0xc);
          *(float *)complex_face.Face._0_8_ = (complex_face.TexMap)->TextureCoordinate[0].x;
          *(float *)(complex_face.Face._0_8_ + 4) = (complex_face.TexMap)->TextureCoordinate[0].z;
          *(float *)(complex_face.Face._0_8_ + 8) = (complex_face.TexMap)->TextureCoordinate[1].y;
          std::__cxx11::
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          ::push_back((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                       *)&complex_faces_toplist.
                          super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                          ._M_impl._M_node._M_size,(value_type *)&__range7);
          SComplexFace::~SComplexFace((SComplexFace *)&__range7);
          pCVar4 = (CAMFImporter_NodeElement_TexMap *)cur_mat;
        }
        cur_mat = (SPP_Material *)pCVar4;
        std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end3);
      }
      PostprocessHelper_SplitFacesByTextureID
                (this,(list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                       *)&complex_faces_toplist.
                          super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                          ._M_impl._M_node._M_size,
                 (list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                  *)local_b8);
      __end3_1 = std::__cxx11::
                 list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                 ::begin((list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                          *)local_b8);
      face_list_cur =
           (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
            *)std::__cxx11::
              list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
              ::end((list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                     *)local_b8);
      while (bVar8 = std::operator!=(&__end3_1,(_Self *)&face_list_cur), bVar8) {
        this_00 = std::
                  _List_iterator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>
                  ::operator*(&__end3_1);
        tmesh = (aiMesh *)pObjectColor_local;
        Vertex_CalculateColor.pVertexColorArray =
             (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
              *)&cur_mat;
        Vertex_CalculateColor.ne_volume_color = (CAMFImporter_NodeElement_Color **)&pMeshList_local;
        Vertex_CalculateColor.pObjectColor = (CAMFImporter_NodeElement_Color **)&ne_volume;
        Vertex_CalculateColor.cur_mat = (SPP_Material **)pVertexColorArray_local;
        this_01 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_01);
        this_01->mPrimitiveTypes = 4;
        VertexCount_Max = (size_t)this_01;
        sVar22 = std::__cxx11::
                 list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                 ::size(this_00);
        *(int *)(VertexCount_Max + 8) = (int)sVar22;
        uVar11 = (ulong)*(uint *)(VertexCount_Max + 8);
        puVar13 = (ulong *)operator_new__(uVar11 << 4 | 8);
        *puVar13 = uVar11;
        paVar25 = (aiFace *)(puVar13 + 1);
        if (uVar11 != 0) {
          local_350 = paVar25;
          do {
            aiFace::aiFace(local_350);
            local_350 = local_350 + 1;
          } while (local_350 != paVar25 + uVar11);
        }
        *(aiFace **)(VertexCount_Max + 0xd0) = paVar25;
        uVar11 = (ulong)(uint)(*(int *)(VertexCount_Max + 8) * 3);
        ppaVar9 = &texcoord_arr.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppaVar9);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&vert_idx_from);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppaVar9,
                   uVar11 * 2);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&vert_idx_from,
                   uVar11 * 2);
        local_1e8 = 0;
        vert_idx_to = Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 ((long)&Vertex_CalculateColor.pVertexCoordinateArray + 7),this_00,
                                 (size_t *)0x0);
        pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             pVertexColorArray_local,vert_idx_to);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &texcoord_arr.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
        aVar26 = Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                           ((anon_class_40_5_b0e7ad54 *)&tmesh,vert_idx_to);
        local_1f8._8_8_ = aVar26._8_8_;
        local_388 = aVar26.r;
        fStack_384 = aVar26.g;
        local_1f8.r = local_388;
        local_1f8.g = fStack_384;
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&vert_idx_from,
                   &local_1f8);
        if (vert_idx_to != local_1e8) {
          Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     ((long)&Vertex_CalculateColor.pVertexCoordinateArray + 6),this_00,vert_idx_to,
                     local_1e8);
        }
        while (vert_idx_to = Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                                       ((anon_class_1_0_00000001 *)
                                        ((long)&Vertex_CalculateColor.pVertexCoordinateArray + 7),
                                        this_00,&local_1e8), vert_idx_to != local_1e8) {
          pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               pVertexColorArray_local,vert_idx_to);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &texcoord_arr.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14);
          aVar26 = Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                             ((anon_class_40_5_b0e7ad54 *)&tmesh,vert_idx_to);
          local_200 = aVar26._8_8_;
          local_3b8 = aVar26.r;
          fStack_3b4 = aVar26.g;
          __range4._0_4_ = local_3b8;
          __range4._4_4_ = fStack_3b4;
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&vert_idx_from,
                     (value_type *)&__range4);
          local_1e8 = local_1e8 + 1;
          if (vert_idx_to != local_1e8) {
            Postprocess_BuildMeshSet::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       ((long)&Vertex_CalculateColor.pVertexCoordinateArray + 6),this_00,vert_idx_to
                       ,local_1e8);
          }
        }
        __end4 = std::__cxx11::
                 list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                 ::begin(this_00);
        face_cur = (SComplexFace *)
                   std::__cxx11::
                   list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                   ::end(this_00);
        while (bVar8 = std::operator!=(&__end4,(_Self *)&face_cur), bVar8) {
          face_color._8_8_ =
               std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator*(&__end4);
          if (((reference)face_color._8_8_)->Color != (CAMFImporter_NodeElement_Color *)0x0) {
            aiColor4t<float>::aiColor4t((aiColor4t<float> *)&vert_idx_new);
            local_240 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&texcoord_arr.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((*(byte *)(*(long *)(face_color._8_8_ + 0x10) + 0x50) & 1) != 0) {
              idx_ind._6_1_ = 1;
              this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_260,"IME: face color composed",
                         (allocator *)((long)&idx_ind + 7));
              DeadlyImportError::DeadlyImportError(this_02,&local_260);
              idx_ind._6_1_ = 0;
              __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError
                         );
            }
            vert_idx_new = *(size_t *)(*(long *)(face_color._8_8_ + 0x10) + 0xd8);
            face_color._0_8_ = *(undefined8 *)(*(long *)(face_color._8_8_ + 0x10) + 0xe0);
            for (idx_vert_new = 0; idx_vert_new < *(uint *)face_color._8_8_;
                idx_vert_new = idx_vert_new + 1) {
              pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&texcoord_arr.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (ulong)*(uint *)(*(long *)(face_color._8_8_ + 8) +
                                                   idx_vert_new * 4));
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &texcoord_arr.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar18);
              std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                        ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                         &vert_idx_from,(value_type *)&vert_idx_new);
              *(int *)(*(long *)(face_color._8_8_ + 8) + idx_vert_new * 4) = (int)local_240;
              local_240 = local_240 + 1;
            }
          }
          std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator++(&__end4);
        }
        pvVar15 = std::__cxx11::
                  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                  ::front(this_00);
        if (pvVar15->TexMap != (CAMFImporter_NodeElement_TexMap *)0x0) {
          idx_vert_used =
               (bool *)std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                 ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                  &texcoord_arr.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar16 = operator_new__(uVar11 * 2);
          for (i_e = 0; i_e < uVar11 << 1; i_e = i_e + 1) {
            *(undefined1 *)((long)pvVar16 + i_e) = 0;
          }
          pvVar15 = std::__cxx11::
                    list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                    ::front(this_00);
          pCVar3 = pvVar15->TexMap;
          pvVar15 = std::__cxx11::
                    list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                    ::front(this_00);
          pCVar4 = pvVar15->TexMap;
          pvVar15 = std::__cxx11::
                    list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                    ::front(this_00);
          pCVar5 = pvVar15->TexMap;
          pvVar15 = std::__cxx11::
                    list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                    ::front(this_00);
          sVar17 = PostprocessHelper_GetTextureID_Or_Create
                             (this,&pCVar3->TextureID_R,&pCVar4->TextureID_G,&pCVar5->TextureID_B,
                              &pvVar15->TexMap->TextureID_A);
          *(int *)(VertexCount_Max + 0xe8) = (int)sVar17;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &col_arr.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,uVar11 * 2);
          __end5 = std::__cxx11::
                   list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                   ::begin(this_00);
          face_cur_1 = (SComplexFace *)
                       std::__cxx11::
                       list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                       ::end(this_00);
          while (bVar8 = std::operator!=(&__end5,(_Self *)&face_cur_1), bVar8) {
            pSVar21 = std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator*(&__end5);
            for (idx_vert = 0; idx_vert < (pSVar21->Face).mNumIndices; idx_vert = idx_vert + 1) {
              uVar11 = (ulong)(pSVar21->Face).mIndices[idx_vert];
              if ((*(byte *)((long)pvVar16 + uVar11) & 1) == 0) {
                paVar1 = pSVar21->TexMap->TextureCoordinate + idx_vert;
                pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)&col_arr.
                                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar11);
                fVar6 = paVar1->y;
                pvVar18->x = paVar1->x;
                pvVar18->y = fVar6;
                pvVar18->z = paVar1->z;
                *(undefined1 *)((long)pvVar16 + uVar11) = 1;
              }
              else {
                pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)&col_arr.
                                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar11);
                bVar8 = aiVector3t<float>::operator!=
                                  (pvVar18,pSVar21->TexMap->TextureCoordinate + idx_vert);
                if (bVar8) {
                  pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        *)&texcoord_arr.
                                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar11
                                      );
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &texcoord_arr.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar18);
                  __x = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::at
                                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                                   &vert_idx_from,uVar11);
                  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                             &vert_idx_from,__x);
                  paVar1 = pSVar21->TexMap->TextureCoordinate + idx_vert;
                  pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        *)&col_arr.
                                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (size_type)idx_vert_used);
                  fVar6 = paVar1->y;
                  pvVar18->x = paVar1->x;
                  pvVar18->y = fVar6;
                  pvVar18->z = paVar1->z;
                  (pSVar21->Face).mIndices[idx_vert] = (uint)idx_vert_used;
                  idx_vert_used = idx_vert_used + 1;
                }
              }
            }
            std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator++(&__end5);
          }
          if (pvVar16 != (void *)0x0) {
            operator_delete__(pvVar16);
          }
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &col_arr.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)idx_vert_used);
        }
        sVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &texcoord_arr.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *(int *)(VertexCount_Max + 4) = (int)sVar22;
        uVar11 = (ulong)*(uint *)(VertexCount_Max + 4);
        paVar19 = (aiVector3t<float> *)operator_new__(uVar11 * 0xc);
        if (uVar11 != 0) {
          local_468 = paVar19;
          do {
            aiVector3t<float>::aiVector3t(local_468);
            local_468 = local_468 + 1;
          } while (local_468 != paVar19 + uVar11);
        }
        *(aiVector3t<float> **)(VertexCount_Max + 0x10) = paVar19;
        uVar11 = (ulong)*(uint *)(VertexCount_Max + 4);
        paVar20 = (aiColor4t<float> *)operator_new__(uVar11 << 4);
        if (uVar11 != 0) {
          local_490 = paVar20;
          do {
            aiColor4t<float>::aiColor4t(local_490);
            local_490 = local_490 + 1;
          } while (local_490 != paVar20 + uVar11);
        }
        *(aiColor4t<float> **)(VertexCount_Max + 0x30) = paVar20;
        pvVar16 = *(void **)(VertexCount_Max + 0x10);
        paVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::data
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &texcoord_arr.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        memcpy(pvVar16,paVar19,(ulong)*(uint *)(VertexCount_Max + 4) * 0xc);
        pvVar16 = *(void **)(VertexCount_Max + 0x30);
        paVar20 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::data
                            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                             &vert_idx_from);
        memcpy(pvVar16,paVar20,(ulong)*(uint *)(VertexCount_Max + 4) << 4);
        sVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &col_arr.
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar22 != 0) {
          uVar11 = (ulong)*(uint *)(VertexCount_Max + 4);
          paVar19 = (aiVector3t<float> *)operator_new__(uVar11 * 0xc);
          if (uVar11 != 0) {
            local_4c8 = paVar19;
            do {
              aiVector3t<float>::aiVector3t(local_4c8);
              local_4c8 = local_4c8 + 1;
            } while (local_4c8 != paVar19 + uVar11);
          }
          *(aiVector3t<float> **)(VertexCount_Max + 0x70) = paVar19;
          pvVar16 = *(void **)(VertexCount_Max + 0x70);
          paVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::data
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               &col_arr.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          memcpy(pvVar16,paVar19,(ulong)*(uint *)(VertexCount_Max + 4) * 0xc);
          *(undefined4 *)(VertexCount_Max + 0xb0) = 2;
        }
        __range4_1 = (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                      *)0x0;
        __end4_1 = std::__cxx11::
                   list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                   ::begin(this_00);
        face_cur_2 = (SComplexFace *)
                     std::__cxx11::
                     list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                     ::end(this_00);
        while (bVar8 = std::operator!=(&__end4_1,(_Self *)&face_cur_2), bVar8) {
          pSVar21 = std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator*(&__end4_1);
          aiFace::operator=((aiFace *)(*(long *)(VertexCount_Max + 0xd0) + (long)__range4_1 * 0x10),
                            &pSVar21->Face);
          std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator++(&__end4_1);
          __range4_1 = (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                        *)((long)&(__range4_1->
                                  super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                                  )._M_impl._M_node.super__List_node_base._M_next + 1);
        }
        sVar22 = std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                           ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                            mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl._M_node._M_size);
        mit._M_node._4_4_ = (undefined4)sVar22;
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                   (value_type_conflict4 *)((long)&mit._M_node + 4));
        std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   mesh_idx.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   _M_node._M_size,(value_type *)&VertexCount_Max);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&vert_idx_from);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &col_arr.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &texcoord_arr.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _List_iterator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>
        ::operator++(&__end3_1);
      }
      std::__cxx11::
      list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
      ::~list((list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
               *)local_b8);
      std::__cxx11::
      list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>::
      ~list((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             *)&complex_faces_toplist.
                super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                ._M_impl._M_node._M_size);
    }
    std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  } while( true );
}

Assistant:

void AMFImporter::Postprocess_BuildMeshSet(const CAMFImporter_NodeElement_Mesh& pNodeElement, const std::vector<aiVector3D>& pVertexCoordinateArray,
											const std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray,
											const CAMFImporter_NodeElement_Color* pObjectColor, std::list<aiMesh*>& pMeshList, aiNode& pSceneNode)
{
std::list<unsigned int> mesh_idx;

	// all data stored in "volume", search for it.
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		const CAMFImporter_NodeElement_Color* ne_volume_color = nullptr;
		const SPP_Material* cur_mat = nullptr;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
		{
			/******************* Get faces *******************/
			const CAMFImporter_NodeElement_Volume* ne_volume = reinterpret_cast<const CAMFImporter_NodeElement_Volume*>(ne_child);

			std::list<SComplexFace> complex_faces_list;// List of the faces of the volume.
			std::list<std::list<SComplexFace> > complex_faces_toplist;// List of the face list for every mesh.

			// check if volume use material
			if(!ne_volume->MaterialID.empty())
			{
				if(!Find_ConvertedMaterial(ne_volume->MaterialID, &cur_mat)) Throw_ID_NotFound(ne_volume->MaterialID);
			}

			// inside "volume" collect all data and place to arrays or create new objects
			for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)
			{
				// color for volume
				if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					ne_volume_color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_volume_child);
				}
				else if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Triangle)// triangles, triangles colors
				{
					const CAMFImporter_NodeElement_Triangle& tri_al = *reinterpret_cast<const CAMFImporter_NodeElement_Triangle*>(ne_volume_child);

					SComplexFace complex_face;

					// initialize pointers
					complex_face.Color = nullptr;
					complex_face.TexMap = nullptr;
					// get data from triangle children: color, texture coordinates.
					if(tri_al.Child.size())
					{
						for(const CAMFImporter_NodeElement* ne_triangle_child: tri_al.Child)
						{
							if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_Color)
								complex_face.Color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_triangle_child);
							else if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_TexMap)
								complex_face.TexMap = reinterpret_cast<const CAMFImporter_NodeElement_TexMap*>(ne_triangle_child);
						}
					}// if(tri_al.Child.size())

					// create new face and store it.
					complex_face.Face.mNumIndices = 3;
					complex_face.Face.mIndices = new unsigned int[3];
					complex_face.Face.mIndices[0] = static_cast<unsigned int>(tri_al.V[0]);
					complex_face.Face.mIndices[1] = static_cast<unsigned int>(tri_al.V[1]);
					complex_face.Face.mIndices[2] = static_cast<unsigned int>(tri_al.V[2]);
					complex_faces_list.push_back(complex_face);
				}
			}// for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)

			/**** Split faces list: one list per mesh ****/
			PostprocessHelper_SplitFacesByTextureID(complex_faces_list, complex_faces_toplist);

			/***** Create mesh for every faces list ******/
			for(std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
			{
				auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t
				{
					size_t rv;

					if(pBiggerThan != nullptr)
					{
						bool found = false;

						for(const SComplexFace& face: pFaceList)
						{
							for(size_t idx_vert = 0; idx_vert < face.Face.mNumIndices; idx_vert++)
							{
								if(face.Face.mIndices[idx_vert] > *pBiggerThan)
								{
									rv = face.Face.mIndices[idx_vert];
									found = true;

									break;
								}
							}

							if(found) break;
						}

						if(!found) return *pBiggerThan;
					}
					else
					{
						rv = pFaceList.front().Face.mIndices[0];
					}// if(pBiggerThan != nullptr) else

					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] < rv)
							{
								if(pBiggerThan != nullptr)
								{
									if(face.Face.mIndices[vi] > *pBiggerThan) rv = face.Face.mIndices[vi];
								}
								else
								{
									rv = face.Face.mIndices[vi];
								}
							}
						}
					}// for(const SComplexFace& face: pFaceList)

					return rv;
				};// auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t

				auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void
				{
					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] == pIdx_From) face.Face.mIndices[vi] = static_cast<unsigned int>(pIdx_To);
						}
					}
				};// auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void

				auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D
				{
					// Color priorities(In descending order):
					// 1. triangle color;
					// 2. vertex color;
					// 3. volume color;
					// 4. object color;
					// 5. material;
					// 6. default - invisible coat.
					//
					// Fill vertices colors in color priority list above that's points from 1 to 6.
					if((pIdx < pVertexColorArray.size()) && (pVertexColorArray[pIdx] != nullptr))// check for vertex color
					{
						if(pVertexColorArray[pIdx]->Composed)
							throw DeadlyImportError("IME: vertex color composed");
						else
							return pVertexColorArray[pIdx]->Color;
					}
					else if(ne_volume_color != nullptr)// check for volume color
					{
						if(ne_volume_color->Composed)
							throw DeadlyImportError("IME: volume color composed");
						else
							return ne_volume_color->Color;
					}
					else if(pObjectColor != nullptr)// check for object color
					{
						if(pObjectColor->Composed)
							throw DeadlyImportError("IME: object color composed");
						else
							return pObjectColor->Color;
					}
					else if(cur_mat != nullptr)// check for material
					{
						return cur_mat->GetColor(pVertexCoordinateArray.at(pIdx).x, pVertexCoordinateArray.at(pIdx).y, pVertexCoordinateArray.at(pIdx).z);
					}
					else// set default color.
					{
						return {0, 0, 0, 0};
					}// if((vi < pVertexColorArray.size()) && (pVertexColorArray[vi] != nullptr)) else

				};// auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D

				aiMesh* tmesh = new aiMesh;

				tmesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;// Only triangles is supported by AMF.
				//
				// set geometry and colors (vertices)
				//
				// copy faces/triangles
				tmesh->mNumFaces = static_cast<unsigned int>(face_list_cur.size());
				tmesh->mFaces = new aiFace[tmesh->mNumFaces];

				// Create vertices list and optimize indices. Optimisation mean following.In AMF all volumes use one big list of vertices. And one volume
				// can use only part of vertices list, for example: vertices list contain few thousands of vertices and volume use vertices 1, 3, 10.
				// Do you need all this thousands of garbage? Of course no. So, optimisation step transformate sparse indices set to continuous.
				size_t VertexCount_Max = tmesh->mNumFaces * 3;// 3 - triangles.
				std::vector<aiVector3D> vert_arr, texcoord_arr;
				std::vector<aiColor4D> col_arr;

				vert_arr.reserve(VertexCount_Max * 2);// "* 2" - see below TODO.
				col_arr.reserve(VertexCount_Max * 2);

				{// fill arrays
					size_t vert_idx_from, vert_idx_to;

					// first iteration.
					vert_idx_to = 0;
					vert_idx_from = VertexIndex_GetMinimal(face_list_cur, nullptr);
					vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
					col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
					if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					// rest iterations
					do
					{
						vert_idx_from = VertexIndex_GetMinimal(face_list_cur, &vert_idx_to);
						if(vert_idx_from == vert_idx_to) break;// all indices are transferred,

						vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
						col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
						vert_idx_to++;
						if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					} while(true);
				}// fill arrays. END.

				//
				// check if triangle colors are used and create additional faces if needed.
				//
				for(const SComplexFace& face_cur: face_list_cur)
				{
					if(face_cur.Color != nullptr)
					{
						aiColor4D face_color;
						size_t vert_idx_new = vert_arr.size();

						if(face_cur.Color->Composed)
							throw DeadlyImportError("IME: face color composed");
						else
							face_color = face_cur.Color->Color;

						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							vert_arr.push_back(vert_arr.at(face_cur.Face.mIndices[idx_ind]));
							col_arr.push_back(face_color);
							face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(vert_idx_new++);
						}
					}// if(face_cur.Color != nullptr)
				}// for(const SComplexFace& face_cur: face_list_cur)

				//
				// if texture is used then copy texture coordinates too.
				//
				if(face_list_cur.front().TexMap != nullptr)
				{
					size_t idx_vert_new = vert_arr.size();
					///TODO: clean unused vertices. "* 2": in certain cases - mesh full of triangle colors - vert_arr will contain duplicated vertices for
					/// colored triangles and initial vertices (for colored vertices) which in real became unused. This part need more thinking about
					/// optimisation.
					bool* idx_vert_used;

					idx_vert_used = new bool[VertexCount_Max * 2];
					for(size_t i = 0, i_e = VertexCount_Max * 2; i < i_e; i++) idx_vert_used[i] = false;

					// This ID's will be used when set materials ID in scene.
					tmesh->mMaterialIndex = static_cast<unsigned int>(PostprocessHelper_GetTextureID_Or_Create(face_list_cur.front().TexMap->TextureID_R,
																						face_list_cur.front().TexMap->TextureID_G,
																						face_list_cur.front().TexMap->TextureID_B,
																						face_list_cur.front().TexMap->TextureID_A));
					texcoord_arr.resize(VertexCount_Max * 2);
					for(const SComplexFace& face_cur: face_list_cur)
					{
						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							const size_t idx_vert = face_cur.Face.mIndices[idx_ind];

							if(!idx_vert_used[idx_vert])
							{
								texcoord_arr.at(idx_vert) = face_cur.TexMap->TextureCoordinate[idx_ind];
								idx_vert_used[idx_vert] = true;
							}
							else if(texcoord_arr.at(idx_vert) != face_cur.TexMap->TextureCoordinate[idx_ind])
							{
								// in that case one vertex is shared with many texture coordinates. We need to duplicate vertex with another texture
								// coordinates.
								vert_arr.push_back(vert_arr.at(idx_vert));
								col_arr.push_back(col_arr.at(idx_vert));
								texcoord_arr.at(idx_vert_new) = face_cur.TexMap->TextureCoordinate[idx_ind];
								face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(idx_vert_new++);
							}
						}// for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
					}// for(const SComplexFace& face_cur: face_list_cur)

					delete [] idx_vert_used;
					// shrink array
					texcoord_arr.resize(idx_vert_new);
				}// if(face_list_cur.front().TexMap != nullptr)

				//
				// copy collected data to mesh
				//
				tmesh->mNumVertices = static_cast<unsigned int>(vert_arr.size());
				tmesh->mVertices = new aiVector3D[tmesh->mNumVertices];
				tmesh->mColors[0] = new aiColor4D[tmesh->mNumVertices];

				memcpy(tmesh->mVertices, vert_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
				memcpy(tmesh->mColors[0], col_arr.data(), tmesh->mNumVertices * sizeof(aiColor4D));
				if(texcoord_arr.size() > 0)
				{
					tmesh->mTextureCoords[0] = new aiVector3D[tmesh->mNumVertices];
					memcpy(tmesh->mTextureCoords[0], texcoord_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
					tmesh->mNumUVComponents[0] = 2;// U and V stored in "x", "y" of aiVector3D.
				}

				size_t idx_face = 0;
				for(const SComplexFace& face_cur: face_list_cur) tmesh->mFaces[idx_face++] = face_cur.Face;

				// store new aiMesh
				mesh_idx.push_back(static_cast<unsigned int>(pMeshList.size()));
				pMeshList.push_back(tmesh);
			}// for(const std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
		}// if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)

	// if meshes was created then assign new indices with current aiNode
	if(!mesh_idx.empty())
	{
		std::list<unsigned int>::const_iterator mit = mesh_idx.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(mesh_idx.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *mit++;
	}// if(mesh_idx.size() > 0)
}